

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O3

REF_STATUS
ref_iso_insert(REF_GRID_conflict *iso_grid_ptr,REF_GRID_conflict ref_grid,REF_DBL *field,
              REF_INT ldim,REF_DBL *in,REF_DBL **out)

{
  uint uVar1;
  REF_MPI ref_mpi;
  REF_GRID_conflict pRVar2;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  REF_CELL pRVar5;
  REF_INT *new_node;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  REF_STATUS RVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  REF_EDGE ref_edge_00;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  REF_INT new_cell;
  REF_EDGE ref_edge;
  REF_INT part;
  REF_INT edge1;
  REF_INT edge2;
  REF_INT edge0;
  REF_GLOB global;
  REF_INT new_nodes [27];
  REF_INT nodes [27];
  REF_INT local_1f8;
  REF_INT local_1f4;
  REF_GRID_conflict local_1f0;
  REF_EDGE local_1e8;
  REF_INT *local_1e0;
  REF_DBL **local_1d8;
  int local_1cc;
  uint local_1c8 [4];
  uint local_1b8;
  uint local_1b4;
  REF_GRID_conflict local_1a8;
  REF_INT local_1a0;
  int local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  undefined4 local_18c;
  REF_DBL *local_128;
  REF_GLOB local_120;
  uint local_118 [28];
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  ref_mpi = ref_grid->mpi;
  local_1d8 = out;
  uVar8 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar8 == 0) {
    local_1a8 = ref_grid;
    local_128 = in;
    uVar8 = ref_grid_create(iso_grid_ptr,ref_mpi);
    if (uVar8 == 0) {
      pRVar2 = *iso_grid_ptr;
      uVar8 = ref_node_initialize_n_global(pRVar2->node,0);
      if (uVar8 == 0) {
        uVar8 = ref_edge_create(&local_1e8,local_1a8);
        ref_edge_00 = local_1e8;
        if (uVar8 == 0) {
          iVar17 = local_1e8->n;
          local_1f0 = pRVar2;
          if ((long)iVar17 < 0) {
            pcVar15 = "malloc new_node of REF_INT negative";
            uVar10 = 0xa6;
LAB_0019b2f3:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   uVar10,"ref_iso_insert",pcVar15);
            return 1;
          }
          local_1e0 = (REF_INT *)malloc((long)iVar17 * 4);
          if (local_1e0 == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0xa6,"ref_iso_insert","malloc new_node of REF_INT NULL");
            return 2;
          }
          if (iVar17 != 0) {
            lVar11 = 0;
            do {
              local_1e0[lVar11] = -1;
              lVar11 = lVar11 + 1;
            } while (lVar11 < ref_edge_00->n);
          }
          local_1f4 = 0;
          local_1a0 = ldim;
          if (0 < ref_edge_00->n) {
            do {
              iVar17 = ref_edge_00->e2n[local_1f4 * 2];
              iVar16 = ref_edge_00->e2n[local_1f4 * 2 + 1];
              uVar8 = ref_edge_part(ref_edge_00,local_1f4,&local_1cc);
              pRVar2 = local_1f0;
              if (uVar8 != 0) {
                pcVar15 = "edge part";
                uVar10 = 0xab;
                goto LAB_0019b041;
              }
              if (ref_mpi->id == local_1cc) {
                dVar21 = field[iVar17];
                dVar19 = field[iVar16];
                dVar22 = dVar21;
                if (dVar21 <= dVar19) {
                  dVar22 = dVar19;
                }
                if (0.0 < dVar22) {
                  if (dVar19 <= dVar21) {
                    dVar21 = dVar19;
                  }
                  if (dVar21 < 0.0) {
                    uVar8 = ref_node_next_global(local_1f0->node,&local_120);
                    if (uVar8 != 0) {
                      pcVar15 = "next global";
                      uVar10 = 0xb0;
                      goto LAB_0019b041;
                    }
                    uVar8 = ref_node_add(pRVar2->node,local_120,local_1e0 + local_1f4);
                    if (uVar8 != 0) {
                      pcVar15 = "add node";
                      uVar10 = 0xb2;
                      goto LAB_0019b041;
                    }
                    dVar19 = field[iVar17];
                    dVar22 = -dVar19;
                    dVar21 = dVar19;
                    if (dVar19 <= dVar22) {
                      dVar21 = dVar22;
                    }
                    dVar20 = (field[iVar16] - dVar19) * 1e+20;
                    if (dVar20 <= -dVar20) {
                      dVar20 = -dVar20;
                    }
                    dVar19 = (double)(~-(ulong)(dVar21 < dVar20) & 0x3fe0000000000000 |
                                     (ulong)(dVar22 / (field[iVar16] - dVar19)) &
                                     -(ulong)(dVar21 < dVar20));
                    dVar21 = 1.0 - dVar19;
                    pRVar3 = local_1a8->node->real;
                    lVar11 = (long)(iVar16 * 0xf);
                    lVar12 = (long)(iVar17 * 0xf);
                    pRVar4 = pRVar2->node->real;
                    lVar13 = (long)local_1e0[local_1f4];
                    pRVar4[lVar13 * 0xf] = pRVar3[lVar11] * dVar19 + pRVar3[lVar12] * dVar21;
                    pRVar4[lVar13 * 0xf + 1] =
                         pRVar3[lVar11 + 1] * dVar19 + pRVar3[lVar12 + 1] * dVar21;
                    pRVar4[lVar13 * 0xf + 2] =
                         pRVar3[lVar11 + 2] * dVar19 + dVar21 * pRVar3[lVar12 + 2];
                  }
                }
              }
              local_1f4 = local_1f4 + 1;
              ref_edge_00 = local_1e8;
            } while (local_1f4 < local_1e8->n);
          }
          pRVar2 = local_1f0;
          uVar8 = ref_node_shift_new_globals(local_1f0->node);
          new_node = local_1e0;
          if (uVar8 == 0) {
            uVar8 = ref_iso_ghost(pRVar2,local_1e8,local_1e0);
            if (uVar8 == 0) {
              uVar8 = ref_iso_interp(pRVar2,local_1e8,new_node,field,local_1a0,local_128,local_1d8);
              if (uVar8 == 0) {
                if (local_1a8->twod == 0) {
                  pRVar5 = local_1a8->cell[8];
                  if (0 < pRVar5->max) {
                    iVar17 = 0;
                    do {
                      RVar9 = ref_cell_nodes(pRVar5,iVar17,&local_a8);
                      if ((RVar9 == 0) && (0 < pRVar5->edge_per)) {
                        lVar11 = 0;
                        uVar14 = 0;
                        do {
                          lVar12 = (long)pRVar5->size_per * (long)iVar17;
                          uVar8 = ref_edge_with(local_1e8,
                                                pRVar5->c2n[pRVar5->e2n[lVar11 * 2] + lVar12],
                                                pRVar5->c2n
                                                [(long)(int)lVar12 +
                                                 (long)pRVar5->e2n[lVar11 * 2 + 1]],&local_1f4);
                          if (uVar8 != 0) {
                            pcVar15 = "cell edge";
                            uVar10 = 0xf5;
                            goto LAB_0019b041;
                          }
                          uVar8 = local_1e0[local_1f4];
                          local_1c8[lVar11] = uVar8;
                          uVar7 = local_1b4;
                          uVar6 = local_1b8;
                          uVar18 = local_1c8[3];
                          uVar1 = local_1c8[1];
                          if (uVar8 != 0xffffffff) {
                            local_118[(int)uVar14] = uVar8;
                            uVar14 = (ulong)((int)uVar14 + 1);
                          }
                          lVar11 = lVar11 + 1;
                        } while (lVar11 < pRVar5->edge_per);
                        iVar16 = (int)uVar14;
                        if (iVar16 != 0) {
                          if (iVar16 == 4) {
                            if ((local_1c8[0] & local_1b4) == 0xffffffff) {
                              local_198 = local_1c8[1];
                              local_1d8 = (REF_DBL **)CONCAT44(local_1d8._4_4_,local_1c8[2]);
                              local_194 = local_1c8[2];
                              local_190 = local_1b8;
                              local_18c = 1;
                              uVar8 = ref_cell_add(local_1f0->cell[3],(REF_INT *)&local_198,
                                                   &local_1f8);
                              uVar18 = local_1c8[3];
                              if (uVar8 != 0) {
                                pcVar15 = "add";
                                uVar10 = 0x10f;
                                goto LAB_0019b041;
                              }
                              local_198 = uVar1;
                              local_194 = uVar6;
                              local_190 = local_1c8[3];
                              local_18c = 1;
                              uVar8 = ref_cell_add(local_1f0->cell[3],(REF_INT *)&local_198,
                                                   &local_1f8);
                              if (uVar8 != 0) {
                                pcVar15 = "add";
                                uVar10 = 0x115;
                                goto LAB_0019b041;
                              }
                              if ((uVar1 & uVar6) == 0xffffffff) {
                                pcVar15 = "found twice";
                                uVar10 = 0x118;
                                goto LAB_0019b2f3;
                              }
                            }
                            else {
                              if ((local_1c8[1] & local_1b8) != 0xffffffff) {
                                if ((local_1c8[2] == 0xffffffff) && (local_1c8[3] == 0xffffffff)) {
                                  local_198 = local_1c8[0];
                                  local_194 = local_1b8;
                                  local_190 = local_1c8[1];
                                  local_18c = 1;
                                  uVar8 = ref_cell_add(local_1f0->cell[3],(REF_INT *)&local_198,
                                                       &local_1f8);
                                  if (uVar8 == 0) {
                                    local_198 = uVar1;
                                    local_194 = uVar6;
                                    local_190 = uVar7;
                                    local_18c = 1;
                                    uVar8 = ref_cell_add(local_1f0->cell[3],(REF_INT *)&local_198,
                                                         &local_1f8);
                                    if (uVar8 == 0) goto LAB_0019b63b;
                                    pcVar15 = "add";
                                    uVar10 = 0x135;
                                  }
                                  else {
                                    pcVar15 = "add";
                                    uVar10 = 0x12f;
                                  }
                                  goto LAB_0019b041;
                                }
                                pcVar15 = "not found";
                                uVar10 = 0x137;
                                goto LAB_0019b2f3;
                              }
                              local_198 = local_1c8[0];
                              local_194 = local_1c8[3];
                              local_1d8 = (REF_DBL **)CONCAT44(local_1d8._4_4_,local_1c8[2]);
                              local_190 = local_1c8[2];
                              local_18c = 1;
                              uVar8 = ref_cell_add(local_1f0->cell[3],(REF_INT *)&local_198,
                                                   &local_1f8);
                              if (uVar8 != 0) {
                                pcVar15 = "add";
                                uVar10 = 0x11f;
                                goto LAB_0019b041;
                              }
                              local_198 = (uint)local_1d8;
                              local_194 = uVar18;
                              local_190 = uVar7;
                              local_18c = 1;
                              uVar8 = ref_cell_add(local_1f0->cell[3],(REF_INT *)&local_198,
                                                   &local_1f8);
                              if (uVar8 != 0) {
                                pcVar15 = "add";
                                uVar10 = 0x125;
                                goto LAB_0019b041;
                              }
                            }
                            if ((uVar18 & (uint)local_1d8) == 0xffffffff) {
                              pcVar15 = "found twice";
                              uVar10 = 0x128;
                              goto LAB_0019b2f3;
                            }
                          }
                          else {
                            if (iVar16 != 3) {
                              printf("nedge %d\n",uVar14);
                              pcVar15 = "implement iso surface tet intersection";
                              uVar8 = 6;
                              uVar10 = 0x13c;
                              uVar14 = 6;
                              goto LAB_0019b044;
                            }
                            local_118[3] = 1;
                            uVar8 = ref_cell_add(local_1f0->cell[3],(REF_INT *)local_118,&local_1f8)
                            ;
                            if (uVar8 != 0) {
                              pcVar15 = "add";
                              uVar10 = 0x103;
                              goto LAB_0019b041;
                            }
                          }
                        }
                      }
LAB_0019b63b:
                      iVar17 = iVar17 + 1;
                    } while (iVar17 < pRVar5->max);
                  }
                }
                else {
                  pRVar5 = local_1a8->cell[3];
                  if (0 < pRVar5->max) {
                    iVar17 = 0;
                    do {
                      RVar9 = ref_cell_nodes(pRVar5,iVar17,&local_a8);
                      if (RVar9 == 0) {
                        uVar8 = ref_edge_with(local_1e8,local_a4,local_a0,(REF_INT *)&local_198);
                        if (uVar8 != 0) {
                          pcVar15 = "e0";
                          uVar10 = 0xd0;
                          goto LAB_0019b041;
                        }
                        uVar8 = ref_edge_with(local_1e8,local_a0,local_a8,(REF_INT *)local_1c8);
                        if (uVar8 != 0) {
                          pcVar15 = "e1";
                          uVar10 = 0xd1;
                          goto LAB_0019b041;
                        }
                        uVar8 = ref_edge_with(local_1e8,local_a8,local_a4,&local_19c);
                        if (uVar8 != 0) {
                          pcVar15 = "e2";
                          uVar10 = 0xd2;
                          goto LAB_0019b041;
                        }
                        uVar8 = local_1e0[(int)local_198];
                        uVar1 = local_1e0[(int)local_1c8[0]];
                        uVar18 = local_1e0[local_19c];
                        if (((uVar8 == 0xffffffff) && (uVar1 != 0xffffffff)) &&
                           (uVar18 != 0xffffffff)) {
                          local_118[2] = 1;
                          local_118[0] = uVar1;
                          local_118[1] = uVar18;
                          uVar8 = ref_cell_add(local_1f0->cell[0],(REF_INT *)local_118,&local_1f8);
                          if (uVar8 != 0) {
                            pcVar15 = "add";
                            uVar10 = 0xda;
                            goto LAB_0019b041;
                          }
                        }
                        else if (((uVar8 == 0xffffffff) || (uVar1 != 0xffffffff)) ||
                                (uVar18 == 0xffffffff)) {
                          if (((uVar8 != 0xffffffff) && (uVar1 != 0xffffffff)) &&
                             (uVar18 == 0xffffffff)) {
                            local_118[2] = 1;
                            local_118[0] = uVar8;
                            local_118[1] = uVar1;
                            uVar8 = ref_cell_add(local_1f0->cell[0],(REF_INT *)local_118,&local_1f8)
                            ;
                            if (uVar8 != 0) {
                              pcVar15 = "add";
                              uVar10 = 0xe6;
                              goto LAB_0019b041;
                            }
                          }
                        }
                        else {
                          local_118[2] = 1;
                          local_118[0] = uVar18;
                          local_118[1] = uVar8;
                          uVar8 = ref_cell_add(local_1f0->cell[0],(REF_INT *)local_118,&local_1f8);
                          if (uVar8 != 0) {
                            pcVar15 = "add";
                            uVar10 = 0xe0;
                            goto LAB_0019b041;
                          }
                        }
                      }
                      iVar17 = iVar17 + 1;
                    } while (iVar17 < pRVar5->max);
                  }
                }
                free(local_1e0);
                ref_edge_free(local_1e8);
                return 0;
              }
              pcVar15 = "interp in to out";
              uVar10 = 0xcb;
            }
            else {
              pcVar15 = "new ghost";
              uVar10 = 200;
            }
          }
          else {
            pcVar15 = "shift iso glob";
            uVar10 = 0xc6;
          }
        }
        else {
          pcVar15 = "create edge";
          uVar10 = 0xa5;
        }
      }
      else {
        pcVar15 = "zero glob";
        uVar10 = 0xa3;
      }
    }
    else {
      pcVar15 = "create";
      uVar10 = 0xa1;
    }
LAB_0019b041:
    uVar14 = (ulong)uVar8;
  }
  else {
    uVar14 = (ulong)uVar8;
    pcVar15 = "sync glob";
    uVar10 = 0x9f;
  }
LAB_0019b044:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar10,
         "ref_iso_insert",uVar14,pcVar15);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_iso_insert(REF_GRID *iso_grid_ptr, REF_GRID ref_grid,
                                  REF_DBL *field, REF_INT ldim, REF_DBL *in,
                                  REF_DBL **out) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GRID iso_grid;
  REF_EDGE ref_edge;
  REF_INT *new_node;
  REF_INT edge, part, new_cell;
  REF_INT node0, node1, node2;
  REF_INT edge0, edge1, edge2;
  REF_GLOB global;
  REF_DBL t1, t0, d;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id = 1;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync glob");

  RSS(ref_grid_create(iso_grid_ptr, ref_mpi), "create");
  iso_grid = *iso_grid_ptr;
  RSS(ref_node_initialize_n_global(ref_grid_node(iso_grid), 0), "zero glob");

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  ref_malloc_init(new_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      if (MAX(field[node0], field[node1]) > 0.0 &&
          MIN(field[node0], field[node1]) < 0.0) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[edge])),
            "add node");
        d = field[node1] - field[node0];
        t1 = 0.5;
        if (ref_math_divisible(field[node0], d)) {
          t1 = -field[node0] / d;
        }
        t0 = 1.0 - t1;
        /*printf("%f %f d %f t %f\n",field[node0],field[node1],d,t);*/
        ref_node_xyz(ref_grid_node(iso_grid), 0, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 0, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 0, node0);
        ref_node_xyz(ref_grid_node(iso_grid), 1, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 1, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 1, node0);
        ref_node_xyz(ref_grid_node(iso_grid), 2, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 2, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 2, node0);
      }
    }
  }
  RSS(ref_node_shift_new_globals(ref_grid_node(iso_grid)), "shift iso glob");

  RSS(ref_iso_ghost(iso_grid, ref_edge, new_node), "new ghost");

  RSS(ref_iso_interp(iso_grid, ref_edge, new_node, field, ldim, in, out),
      "interp in to out");

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge0), "e0");
      RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge1), "e1");
      RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge2), "e2");
      node0 = new_node[edge0];
      node1 = new_node[edge1];
      node2 = new_node[edge2];
      if (REF_EMPTY == node0 && REF_EMPTY != node1 && REF_EMPTY != node2) {
        new_nodes[0] = node1;
        new_nodes[1] = node2;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
      if (REF_EMPTY != node0 && REF_EMPTY == node1 && REF_EMPTY != node2) {
        new_nodes[0] = node2;
        new_nodes[1] = node0;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
      if (REF_EMPTY != node0 && REF_EMPTY != node1 && REF_EMPTY == node2) {
        new_nodes[0] = node0;
        new_nodes[1] = node1;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  } else {
    REF_INT cell_edge;
    REF_INT edge_nodes[6];
    REF_INT nedge;
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_BOOL found;
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      nedge = 0;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        RSS(ref_edge_with(ref_edge, ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                          ref_cell_e2n(ref_cell, 1, cell_edge, cell), &edge),
            "cell edge");
        edge_nodes[cell_edge] = new_node[edge];
        if (REF_EMPTY != edge_nodes[cell_edge]) {
          new_nodes[nedge] = edge_nodes[cell_edge];
          nedge++;
        }
      }
      switch (nedge) {
        case 0:
          /* cell is not intersected by iso surface */
          break;
        case 3:
          new_nodes[3] = id;
          RSS(ref_cell_add(ref_grid_tri(iso_grid), new_nodes, &new_cell),
              "add");
          break;
        case 4:
          found = REF_FALSE;
          if (REF_EMPTY == edge_nodes[0] && REF_EMPTY == edge_nodes[5]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[2];
            tri_nodes[2] = edge_nodes[4];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[3];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          if (REF_EMPTY == edge_nodes[1] && REF_EMPTY == edge_nodes[4]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[0];
            tri_nodes[1] = edge_nodes[3];
            tri_nodes[2] = edge_nodes[2];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[2];
            tri_nodes[1] = edge_nodes[3];
            tri_nodes[2] = edge_nodes[5];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          if (REF_EMPTY == edge_nodes[2] && REF_EMPTY == edge_nodes[3]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[0];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[1];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[5];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          RAS(found, "not found");
          break;

        default:
          printf("nedge %d\n", nedge);
          RSS(REF_IMPLEMENT, "implement iso surface tet intersection");
          break;
      }
    }
  }

  ref_free(new_node);
  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}